

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O2

void test_function_4ms(void)

{
  LatencyCollector *_lat;
  LatencyCollectWrapper LCW__func_latency__;
  allocator local_41;
  string local_40;
  LatencyCollectWrapper local_20;
  
  _lat = global_lat;
  std::__cxx11::string::string((string *)&local_40,"test_function_4ms",&local_41);
  LatencyCollectWrapper::LatencyCollectWrapper(&local_20,_lat,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_40._M_dataplus._M_p = (pointer)0x3;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_40);
  inner_function();
  LatencyCollectWrapper::~LatencyCollectWrapper(&local_20);
  return;
}

Assistant:

void test_function_4ms() {
    collectFuncLatency(global_lat);
    std::this_thread::sleep_for(std::chrono::milliseconds(3));
    inner_function();
}